

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError file2string(char **bufp,FILE *file)

{
  int iVar1;
  CURLcode CVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  size_t total;
  long lVar7;
  ParameterError unaff_EBP;
  long lVar8;
  size_t len;
  undefined1 *__ptr;
  bool bVar9;
  dynbuf dyn;
  char buffer [4096];
  dynbuf local_1058;
  undefined1 local_1038 [4104];
  
  curlx_dyn_init(&local_1058,0x400000000);
  if (file != (FILE *)0x0) {
    do {
      __ptr = local_1038;
      sVar3 = fread(__ptr,1,0x1000,(FILE *)file);
      iVar1 = ferror((FILE *)file);
      if (iVar1 == 0) {
        do {
          bVar9 = sVar3 == 0;
          if (bVar9) break;
          sVar4 = 0;
          do {
            len = sVar4;
            if ((0x1bfeU >> (__ptr[sVar4] & 0x1f) & 1) == 0 && (byte)__ptr[sVar4] < 0xe) break;
            sVar4 = sVar4 + 1;
            len = sVar3;
          } while (sVar3 != sVar4);
          CVar2 = curlx_dyn_addn(&local_1058,__ptr,len);
          if (CVar2 == CURLE_OK) {
            if (sVar3 == len) {
              sVar3 = 0;
            }
            else {
              lVar7 = sVar3 - len;
              lVar6 = lVar7;
              if (lVar7 != 0) {
                lVar8 = 0;
                do {
                  lVar6 = lVar8;
                  if ((0x1bfeU >> (__ptr[lVar8 + len] & 0x1f) & 1) != 0 ||
                      0xd < (byte)__ptr[lVar8 + len]) break;
                  lVar8 = lVar8 + 1;
                  lVar6 = lVar7;
                } while (lVar7 != lVar8);
              }
              __ptr = __ptr + lVar6 + len;
              sVar3 = lVar7 - lVar6;
            }
          }
          else {
            unaff_EBP = PARAM_NO_MEM;
          }
        } while (CVar2 == CURLE_OK);
      }
      else {
        curlx_dyn_free(&local_1058);
        *bufp = (char *)0x0;
        unaff_EBP = PARAM_READ_ERROR;
        bVar9 = false;
      }
      if (!bVar9) {
        return unaff_EBP;
      }
      iVar1 = feof((FILE *)file);
    } while (iVar1 == 0);
  }
  pcVar5 = curlx_dyn_ptr(&local_1058);
  *bufp = pcVar5;
  return PARAM_OK;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  struct curlx_dynbuf dyn;
  curlx_dyn_init(&dyn, MAX_FILE2STRING);
  if(file) {
    do {
      char buffer[4096];
      char *ptr;
      size_t nread = fread(buffer, 1, sizeof(buffer), file);
      if(ferror(file)) {
        curlx_dyn_free(&dyn);
        *bufp = NULL;
        return PARAM_READ_ERROR;
      }
      ptr = buffer;
      while(nread) {
        size_t nlen = memcrlf(ptr, FALSE, nread);
        if(curlx_dyn_addn(&dyn, ptr, nlen))
          return PARAM_NO_MEM;
        nread -= nlen;

        if(nread) {
          ptr += nlen;
          nlen = memcrlf(ptr, TRUE, nread);
          ptr += nlen;
          nread -= nlen;
        }
      }
    } while(!feof(file));
  }
  *bufp = curlx_dyn_ptr(&dyn);
  return PARAM_OK;
}